

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_state.cc
# Opt level: O0

bool SerializeContextState(SSL_CTX *ctx,CBB *cbb)

{
  bool bVar1;
  int iVar2;
  reference ppsVar3;
  ssl_session_st **sess;
  iterator __end1;
  iterator __begin1;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *__range1;
  undefined1 local_100 [8];
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> sessions;
  uint8_t keys [48];
  undefined1 local_b0 [8];
  CBB ticket_keys;
  CBB ctx_sessions;
  CBB out;
  CBB *cbb_local;
  SSL_CTX *ctx_local;
  
  iVar2 = CBB_add_u24_length_prefixed(cbb,(CBB *)((long)&ctx_sessions.u + 0x18));
  if ((((iVar2 == 0) || (iVar2 = CBB_add_u16((CBB *)((long)&ctx_sessions.u + 0x18),0), iVar2 == 0))
      || (iVar2 = SSL_CTX_get_tlsext_ticket_keys
                            (ctx,&sessions.
                                  super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,0x30),
         iVar2 == 0)) ||
     (((iVar2 = CBB_add_u8_length_prefixed((CBB *)((long)&ctx_sessions.u + 0x18),(CBB *)local_b0),
       iVar2 == 0 ||
       (iVar2 = CBB_add_bytes((CBB *)local_b0,
                              (uint8_t *)
                              &sessions.
                               super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,0x30), iVar2 == 0)
       ) || (iVar2 = CBB_add_asn1((CBB *)((long)&ctx_sessions.u + 0x18),
                                  (CBB *)((long)&ticket_keys.u + 0x18),0x20000010), iVar2 == 0)))) {
    return false;
  }
  std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
            ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_100);
  lh_SSL_SESSION_doall_arg
            (ctx->sessions,push_session,
             (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_100);
  __end1 = std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::begin
                     ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_100);
  sess = (ssl_session_st **)
         std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::end
                   ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_100);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<ssl_session_st_**,_std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>_>
                                *)&sess);
    if (!bVar1) {
      iVar2 = CBB_flush(cbb);
      ctx_local._7_1_ = iVar2 != 0;
LAB_001565f7:
      std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::~vector
                ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_100);
      return ctx_local._7_1_;
    }
    ppsVar3 = __gnu_cxx::
              __normal_iterator<ssl_session_st_**,_std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>_>
              ::operator*(&__end1);
    bVar1 = bssl::ssl_session_serialize(*ppsVar3,(CBB *)((long)&ticket_keys.u + 0x18));
    if (!bVar1) {
      ctx_local._7_1_ = false;
      goto LAB_001565f7;
    }
    __gnu_cxx::
    __normal_iterator<ssl_session_st_**,_std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool SerializeContextState(SSL_CTX *ctx, CBB *cbb) {
  CBB out, ctx_sessions, ticket_keys;
  uint8_t keys[48];
  if (!CBB_add_u24_length_prefixed(cbb, &out) ||
      !CBB_add_u16(&out, 0 /* version */) ||
      !SSL_CTX_get_tlsext_ticket_keys(ctx, &keys, sizeof(keys)) ||
      !CBB_add_u8_length_prefixed(&out, &ticket_keys) ||
      !CBB_add_bytes(&ticket_keys, keys, sizeof(keys)) ||
      !CBB_add_asn1(&out, &ctx_sessions, CBS_ASN1_SEQUENCE)) {
    return false;
  }
  std::vector<SSL_SESSION *> sessions;
  lh_SSL_SESSION_doall_arg(ctx->sessions, push_session, &sessions);
  for (const auto &sess : sessions) {
    if (!ssl_session_serialize(sess, &ctx_sessions)) {
      return false;
    }
  }
  return CBB_flush(cbb);
}